

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManFlowSetMarkA_rec(Aig_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = *(ulong *)&pObj->field_0x18;
  while( true ) {
    if ((uVar1 & 0x10) != 0) {
      return;
    }
    *(ulong *)&pObj->field_0x18 = uVar1 | 0x10;
    uVar2 = (uint)uVar1 & 7;
    if (uVar2 == 2) {
      return;
    }
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if (uVar2 == 1) break;
    if (((uint)uVar1 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                    ,0x3a8,"void Llb_ManFlowSetMarkA_rec(Aig_Obj_t *)");
    }
    Llb_ManFlowSetMarkA_rec((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    uVar1 = *(ulong *)&pObj->field_0x18;
  }
  return;
}

Assistant:

void Llb_ManFlowSetMarkA_rec( Aig_Obj_t * pObj )
{
    if ( pObj->fMarkA )
        return;
    pObj->fMarkA = 1;
    if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManFlowSetMarkA_rec( Aig_ObjFanin0(pObj) );
    Llb_ManFlowSetMarkA_rec( Aig_ObjFanin1(pObj) );
}